

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

string_view __thiscall wabt::ObjdumpNames::Get(ObjdumpNames *this,Index index)

{
  size_type sVar1;
  const_reference str;
  Index index_local;
  ObjdumpNames *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->names);
  if (index < sVar1) {
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->names,(ulong)index);
    string_view::string_view((string_view *)&this_local,str);
  }
  else {
    string_view::string_view((string_view *)&this_local);
  }
  return _this_local;
}

Assistant:

string_view ObjdumpNames::Get(Index index) const {
  return index < names.size() ? names[index] : string_view();
}